

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

int uv__read_start(uv_stream_t *stream,uv_alloc_cb alloc_cb,uv_read_cb read_cb)

{
  uint *puVar1;
  uint uVar2;
  
  if ((UV_TTY < stream->type) || ((0x5080U >> (stream->type & (UV_SIGNAL|UV_UDP)) & 1) == 0)) {
    __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x5e1,"int uv__read_start(uv_stream_t *, uv_alloc_cb, uv_read_cb)");
  }
  stream->flags = stream->flags & 0xffffe7ff | 0x1000;
  if ((stream->io_watcher).fd < 0) {
    __assert_fail("uv__stream_fd(stream) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x5e9,"int uv__read_start(uv_stream_t *, uv_alloc_cb, uv_read_cb)");
  }
  if (alloc_cb != (uv_alloc_cb)0x0) {
    stream->read_cb = read_cb;
    stream->alloc_cb = alloc_cb;
    uv__io_start(stream->loop,&stream->io_watcher,1);
    uVar2 = stream->flags;
    if (((uVar2 & 4) == 0) && (stream->flags = uVar2 | 4, (uVar2 & 8) != 0)) {
      puVar1 = &stream->loop->active_handles;
      *puVar1 = *puVar1 + 1;
    }
    return 0;
  }
  __assert_fail("alloc_cb",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                ,0x5ea,"int uv__read_start(uv_stream_t *, uv_alloc_cb, uv_read_cb)");
}

Assistant:

int uv__read_start(uv_stream_t* stream,
                   uv_alloc_cb alloc_cb,
                   uv_read_cb read_cb) {
  assert(stream->type == UV_TCP || stream->type == UV_NAMED_PIPE ||
      stream->type == UV_TTY);

  /* The UV_HANDLE_READING flag is irrelevant of the state of the stream - it
   * just expresses the desired state of the user. */
  stream->flags |= UV_HANDLE_READING;
  stream->flags &= ~UV_HANDLE_READ_EOF;

  /* TODO: try to do the read inline? */
  assert(uv__stream_fd(stream) >= 0);
  assert(alloc_cb);

  stream->read_cb = read_cb;
  stream->alloc_cb = alloc_cb;

  uv__io_start(stream->loop, &stream->io_watcher, POLLIN);
  uv__handle_start(stream);
  uv__stream_osx_interrupt_select(stream);

  return 0;
}